

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MockGeneratorContext::~MockGeneratorContext
          (MockGeneratorContext *this)

{
  ~MockGeneratorContext(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

void ExpectFileMatches(const std::string& virtual_filename,
                         const std::string& physical_filename) {
    auto it = files_.find(virtual_filename);
    ASSERT_TRUE(it != files_.end())
        << "Generator failed to generate file: " << virtual_filename;

    std::string expected_contents = *it->second;
    std::string actual_contents;
    ABSL_CHECK_OK(File::GetContents(
        absl::StrCat(TestUtil::TestSourceDir(), "/", physical_filename),
        &actual_contents, true))
        << physical_filename;

#ifdef WRITE_FILES  // Define to debug mismatched files.
    ABSL_CHECK_OK(File::SetContents("/tmp/expected.cc", expected_contents,
                                    true));
    ABSL_CHECK_OK(
        File::SetContents("/tmp/actual.cc", actual_contents, true));
#endif

    ASSERT_EQ(expected_contents, actual_contents)
        << physical_filename
        << " needs to be regenerated.  Please run "
           "generate_descriptor_proto.sh. "
           "Then add this file to your CL.";
  }